

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1b8a13::CAPIExternalCommand::startExternalCommand
          (CAPIExternalCommand *this,BuildSystem *system,TaskInterface ti)

{
  void *pvVar1;
  size_t sVar2;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_1U>
  *this_00;
  undefined8 uVar3;
  StringRef local_a0;
  BuildNode *local_90;
  string local_88 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  iterator __end2;
  iterator __begin2;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_1U>
  *__range2;
  BuildSystem *system_local;
  CAPIExternalCommand *this_local;
  TaskInterface ti_local;
  
  sVar2 = llvm::SmallVectorBase::size((SmallVectorBase *)&this->outputNodeNames);
  std::vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
  ::reserve(&(this->super_ExternalCommand).super_Command.outputs,sVar2);
  this_00 = &this->outputNodeNames;
  __end2 = (iterator)
           (this_00->
           super_SmallVectorImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ).
           super_SmallVectorTemplateBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
           .
           super_SmallVectorTemplateCommon<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
           .super_SmallVectorBase.BeginX;
  pvVar1 = (this_00->
           super_SmallVectorImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ).
           super_SmallVectorTemplateBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
           .
           super_SmallVectorTemplateCommon<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
           .super_SmallVectorBase.BeginX;
  sVar2 = llvm::SmallVectorBase::size((SmallVectorBase *)this_00);
  name.field_2._8_8_ = (long)pvVar1 + sVar2 * 0x20;
  for (; __end2 != (iterator)name.field_2._8_8_; __end2 = __end2 + 1) {
    std::__cxx11::string::string(local_88,(string *)__end2);
    uVar3 = std::__cxx11::string::data();
    local_a0.Data = (char *)uVar3;
    uVar3 = std::__cxx11::string::length();
    local_a0.Length = uVar3;
    local_90 = llbuild::buildsystem::BuildSystem::lookupNode(system,local_a0);
    std::
    vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>::
    push_back(&(this->super_ExternalCommand).super_Command.outputs,&local_90);
    std::__cxx11::string::~string(local_88);
  }
  (*(this->cAPIDelegate).start)
            ((this->cAPIDelegate).context,(llb_buildsystem_command_t *)this,
             (llb_buildsystem_interface_t *)system,(llb_task_interface_t)ti);
  return;
}

Assistant:

virtual void startExternalCommand(BuildSystem& system,
                                    core::TaskInterface ti) override {
    outputs.reserve(outputNodeNames.size());
    for (auto name: outputNodeNames) {
      outputs.push_back(system.lookupNode(name));
    }
    cAPIDelegate.start(cAPIDelegate.context,
                       (llb_buildsystem_command_t*)this,
                       (llb_buildsystem_interface_t*)&system,
                       *reinterpret_cast<llb_task_interface_t*>(&ti));
  }